

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt5_endpoint_optimizer::compute(dxt5_endpoint_optimizer *this,params *p,results *r)

{
  vector<unsigned_char> *this_00;
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint8 uVar4;
  byte bVar5;
  uint32 **ppuVar6;
  uint32 *puVar7;
  uchar *puVar8;
  uint32 *puVar9;
  results *prVar10;
  uchar __tmp;
  uint low_endpoint;
  uint uVar11;
  uint uVar12;
  params *ppVar13;
  uint uVar14;
  uint uVar15;
  uint high_endpoint;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  
  this->m_pParams = p;
  this->m_pResults = r;
  if (p->m_num_pixels == 0) {
    return false;
  }
  if (p->m_pPixels == (color_quad_u8 *)0x0) {
    bVar21 = false;
  }
  else {
    if ((this->m_unique_values).m_size != 0) {
      (this->m_unique_values).m_size = 0;
    }
    if ((this->m_unique_value_weights).m_size != 0) {
      (this->m_unique_value_weights).m_size = 0;
    }
    this_00 = &this->m_unique_values;
    memset(this->m_unique_value_map,0xff,0x400);
    if (p->m_num_pixels == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 0;
      do {
        bVar3 = p->m_pPixels[uVar19].field_0.c[p->m_comp_index];
        uVar12 = this->m_unique_value_map[bVar3];
        if (uVar12 == 0xffffffff) {
          uVar12 = (this->m_unique_values).m_size;
          this->m_unique_value_map[bVar3] = uVar12;
          uVar11 = uVar12;
          if ((this->m_unique_values).m_capacity <= uVar12) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this_00,uVar12 + 1,true,1,(object_mover)0x0,false);
            uVar11 = (this->m_unique_values).m_size;
          }
          (this->m_unique_values).m_p[uVar11] = bVar3;
          puVar1 = &(this->m_unique_values).m_size;
          *puVar1 = *puVar1 + 1;
          uVar11 = (this->m_unique_value_weights).m_size;
          if ((this->m_unique_value_weights).m_capacity <= uVar11) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_unique_value_weights,uVar11 + 1,true,4,
                       (object_mover)0x0,false);
            uVar11 = (this->m_unique_value_weights).m_size;
          }
          (this->m_unique_value_weights).m_p[uVar11] = 0;
          puVar1 = &(this->m_unique_value_weights).m_size;
          *puVar1 = *puVar1 + 1;
        }
        puVar2 = (this->m_unique_value_weights).m_p + uVar12;
        *puVar2 = *puVar2 + 1;
        uVar19 = uVar19 + 1;
        uVar12 = p->m_num_pixels;
      } while (uVar19 < uVar12);
      uVar11 = (this->m_unique_values).m_size;
      uVar19 = (ulong)uVar11;
      if (uVar11 == 1) {
        r->m_block_type = '\0';
        r->m_reordered = false;
        r->m_error = 0;
        uVar4 = *this_00->m_p;
        r->m_first_endpoint = uVar4;
        r->m_second_endpoint = uVar4;
        memset(r->m_pSelectors,0,(ulong)uVar12);
        return true;
      }
    }
    uVar12 = (this->m_trial_selectors).m_size;
    uVar11 = (uint)uVar19;
    if (uVar12 != uVar11) {
      uVar15 = uVar11;
      if (uVar12 <= uVar11) {
        if ((this->m_trial_selectors).m_capacity < uVar11) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_trial_selectors,uVar11,uVar12 + 1 == uVar11,1,
                     (object_mover)0x0,false);
          uVar12 = (this->m_trial_selectors).m_size;
        }
        memset((this->m_trial_selectors).m_p + uVar12,0,(ulong)(uVar11 - uVar12));
        uVar15 = (this->m_unique_values).m_size;
      }
      (this->m_trial_selectors).m_size = uVar11;
      uVar19 = (ulong)uVar15;
    }
    uVar12 = (this->m_best_selectors).m_size;
    uVar11 = (uint)uVar19;
    if (uVar12 != uVar11) {
      uVar15 = uVar11;
      if (uVar12 <= uVar11) {
        if ((this->m_best_selectors).m_capacity < uVar11) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_best_selectors,uVar11,uVar12 + 1 == uVar11,1,
                     (object_mover)0x0,false);
          uVar12 = (this->m_best_selectors).m_size;
        }
        memset((this->m_best_selectors).m_p + uVar12,0,(ulong)(uVar11 - uVar12));
        uVar15 = (this->m_unique_values).m_size;
      }
      (this->m_best_selectors).m_size = uVar11;
      uVar19 = (ulong)uVar15;
    }
    r->m_error = 0xffffffffffffffff;
    if ((int)uVar19 != 1) {
      uVar18 = 1;
      uVar16 = 0;
      do {
        uVar20 = uVar16 + 1;
        if (uVar20 < uVar19) {
          bVar3 = this_00->m_p[uVar16];
          uVar16 = uVar18;
          do {
            evaluate_solution(this,(uint)bVar3,(uint)(this->m_unique_values).m_p[uVar16]);
            uVar16 = uVar16 + 1;
            uVar19 = (ulong)(this->m_unique_values).m_size;
          } while (uVar16 < uVar19);
        }
        uVar18 = uVar18 + 1;
        uVar16 = uVar20;
      } while (uVar20 < (int)uVar19 - 1);
    }
    prVar10 = this->m_pResults;
    if ((cCRNDXTQualityNormal < this->m_pParams->m_quality) && (prVar10->m_error != 0)) {
      sparse_bit_array::resize(&this->m_flags,0x10000);
      sparse_bit_array::clear_all_bits(&this->m_flags);
      bVar21 = this->m_pParams->m_quality == cCRNDXTQualityUber;
      uVar11 = (uint)!bVar21 << 3 | 0xfffffff0;
      uVar15 = (uint)bVar21 * 8 + 9;
      uVar12 = uVar11;
      do {
        prVar10 = this->m_pResults;
        low_endpoint = prVar10->m_first_endpoint + uVar12;
        if (-1 < (int)low_endpoint) {
          if (0xff < low_endpoint) goto LAB_0017427f;
          uVar17 = uVar11;
          do {
            uVar14 = (uint)this->m_pResults->m_second_endpoint;
            high_endpoint = uVar17 + uVar14;
            if (-1 < (int)high_endpoint) {
              if (0xff < high_endpoint) break;
              uVar14 = uVar14 + low_endpoint * 0x100 + uVar17;
              ppuVar6 = (this->m_flags).m_ppGroups;
              puVar9 = ppuVar6[low_endpoint >> 1];
              if (((puVar9 == (uint32 *)0x0) ||
                  ((*(uint *)((long)puVar9 + (ulong)(uVar14 >> 3 & 0x3c)) >> (high_endpoint & 0x1f)
                   & 1) == 0)) &&
                 ((puVar7 = ppuVar6[high_endpoint >> 1], puVar7 == (uint32 *)0x0 ||
                  ((*(uint *)((long)puVar7 +
                             (ulong)((high_endpoint * 0x100 | low_endpoint) >> 3 & 0x3c)) &
                   1 << ((byte)low_endpoint & 0x1f)) == 0)))) {
                if (puVar9 == (uint32 *)0x0) {
                  puVar9 = (uint32 *)crnlib_malloc(0x40);
                  if (puVar9 == (uint32 *)0x0) {
                    crnlib_assert("p",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.h"
                                  ,199);
                  }
                  puVar9[0xc] = 0;
                  puVar9[0xd] = 0;
                  puVar9[0xe] = 0;
                  puVar9[0xf] = 0;
                  puVar9[8] = 0;
                  puVar9[9] = 0;
                  puVar9[10] = 0;
                  puVar9[0xb] = 0;
                  puVar9[4] = 0;
                  puVar9[5] = 0;
                  puVar9[6] = 0;
                  puVar9[7] = 0;
                  puVar9[0] = 0;
                  puVar9[1] = 0;
                  puVar9[2] = 0;
                  puVar9[3] = 0;
                  (this->m_flags).m_ppGroups[low_endpoint >> 1] = puVar9;
                }
                puVar2 = (uint *)((long)puVar9 + (ulong)(uVar14 >> 3 & 0x3c));
                *puVar2 = *puVar2 | 1 << ((byte)high_endpoint & 0x1f);
                evaluate_solution(this,low_endpoint,high_endpoint);
              }
            }
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar15);
      prVar10 = this->m_pResults;
    }
LAB_0017427f:
    prVar10->m_reordered = false;
    bVar3 = prVar10->m_first_endpoint;
    bVar5 = prVar10->m_second_endpoint;
    if (bVar3 == bVar5) {
      if ((this->m_best_selectors).m_size != 0) {
        uVar19 = 0;
        do {
          (this->m_best_selectors).m_p[uVar19] = '\0';
          uVar19 = uVar19 + 1;
        } while (uVar19 < (this->m_best_selectors).m_size);
      }
    }
    else if (prVar10->m_block_type == '\0') {
      if (bVar3 <= bVar5) {
        prVar10->m_first_endpoint = bVar5;
        prVar10->m_second_endpoint = bVar3;
        this->m_pResults->m_reordered = true;
        if ((this->m_best_selectors).m_size != 0) {
          uVar19 = 0;
          do {
            puVar8 = (this->m_best_selectors).m_p;
            puVar8[uVar19] = *(uchar *)((long)&g_eight_alpha_invert_table + (ulong)puVar8[uVar19]);
            uVar19 = uVar19 + 1;
          } while (uVar19 < (this->m_best_selectors).m_size);
        }
      }
    }
    else if (bVar5 < bVar3) {
      prVar10->m_first_endpoint = bVar5;
      prVar10->m_second_endpoint = bVar3;
      this->m_pResults->m_reordered = true;
      if ((this->m_best_selectors).m_size != 0) {
        uVar19 = 0;
        do {
          puVar8 = (this->m_best_selectors).m_p;
          puVar8[uVar19] = *(uchar *)((long)&g_six_alpha_invert_table + (ulong)puVar8[uVar19]);
          uVar19 = uVar19 + 1;
        } while (uVar19 < (this->m_best_selectors).m_size);
      }
    }
    ppVar13 = this->m_pParams;
    bVar21 = true;
    if (ppVar13->m_num_pixels != 0) {
      uVar19 = 0;
      do {
        this->m_pResults->m_pSelectors[uVar19] =
             (this->m_best_selectors).m_p
             [(uint)this->m_unique_value_map
                    [ppVar13->m_pPixels[uVar19].field_0.c[ppVar13->m_comp_index]]];
        uVar19 = uVar19 + 1;
        ppVar13 = this->m_pParams;
      } while (uVar19 < ppVar13->m_num_pixels);
    }
  }
  return bVar21;
}

Assistant:

bool dxt5_endpoint_optimizer::compute(const params& p, results& r)
    {
        m_pParams = &p;
        m_pResults = &r;

        if ((!p.m_num_pixels) || (!p.m_pPixels))
        {
            return false;
        }

        m_unique_values.resize(0);
        m_unique_value_weights.resize(0);

        for (uint i = 0; i < 256; i++)
        {
            m_unique_value_map[i] = -1;
        }

        for (uint i = 0; i < p.m_num_pixels; i++)
        {
            uint alpha = p.m_pPixels[i][p.m_comp_index];

            int index = m_unique_value_map[alpha];

            if (index == -1)
            {
                index = m_unique_values.size();

                m_unique_value_map[alpha] = index;

                m_unique_values.push_back(static_cast<uint8>(alpha));
                m_unique_value_weights.push_back(0);
            }

            m_unique_value_weights[index]++;
        }

        if (m_unique_values.size() == 1)
        {
            r.m_block_type = 0;
            r.m_reordered = false;
            r.m_error = 0;
            r.m_first_endpoint = m_unique_values[0];
            r.m_second_endpoint = m_unique_values[0];
            memset(r.m_pSelectors, 0, p.m_num_pixels);
            return true;
        }

        m_trial_selectors.resize(m_unique_values.size());
        m_best_selectors.resize(m_unique_values.size());

        r.m_error = cUINT64_MAX;

        for (uint i = 0; i < m_unique_values.size() - 1; i++)
        {
            const uint low_endpoint = m_unique_values[i];

            for (uint j = i + 1; j < m_unique_values.size(); j++)
            {
                const uint high_endpoint = m_unique_values[j];

                evaluate_solution(low_endpoint, high_endpoint);
            }
        }

        if ((m_pParams->m_quality >= cCRNDXTQualityBetter) && (m_pResults->m_error))
        {
            m_flags.resize(256 * 256);
            m_flags.clear_all_bits();

            const int cProbeAmount = (m_pParams->m_quality == cCRNDXTQualityUber) ? 16 : 8;

            for (int l_delta = -cProbeAmount; l_delta <= cProbeAmount; l_delta++)
            {
                const int l = m_pResults->m_first_endpoint + l_delta;
                if (l < 0)
                {
                    continue;
                }
                else if (l > 255)
                {
                    break;
                }
                const uint bit_index = l * 256;

                for (int h_delta = -cProbeAmount; h_delta <= cProbeAmount; h_delta++)
                {
                    const int h = m_pResults->m_second_endpoint + h_delta;
                    if (h < 0)
                    {
                        continue;
                    }
                    else if (h > 255)
                    {
                        break;
                    }

                    //if (m_flags.get_bit(bit_index + h))
                    //   continue;
                    if ((m_flags.get_bit(bit_index + h)) || (m_flags.get_bit(h * 256 + l)))
                    {
                        continue;
                    }

                    m_flags.set_bit(bit_index + h);

                    evaluate_solution(static_cast<uint>(l), static_cast<uint>(h));
                }
            }
        }

        m_pResults->m_reordered = false;
        if (m_pResults->m_first_endpoint == m_pResults->m_second_endpoint)
        {
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = 0;
            }
        }
        else if (m_pResults->m_block_type)
        {
            //if (l > h)
            //   eight alpha
            // else
            //   six alpha

            if (m_pResults->m_first_endpoint > m_pResults->m_second_endpoint)
            {
                std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
                m_pResults->m_reordered = true;
                for (uint i = 0; i < m_best_selectors.size(); i++)
                {
                    m_best_selectors[i] = g_six_alpha_invert_table[m_best_selectors[i]];
                }
            }
        }
        else if (m_pResults->m_first_endpoint <= m_pResults->m_second_endpoint)
        {
            std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
            m_pResults->m_reordered = true;
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = g_eight_alpha_invert_table[m_best_selectors[i]];
            }
        }

        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            uint alpha = m_pParams->m_pPixels[i][m_pParams->m_comp_index];

            int index = m_unique_value_map[alpha];

            m_pResults->m_pSelectors[i] = m_best_selectors[index];
        }

        return true;
    }